

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O2

void __thiscall
Rml::Property::Property<std::vector<Rml::Animation,std::allocator<Rml::Animation>>>
          (Property *this,vector<Rml::Animation,_std::allocator<Rml::Animation>_> *value,Unit unit,
          int specificity)

{
  Variant::Variant<std::vector<Rml::Animation,std::allocator<Rml::Animation>>&,void>
            (&this->value,value);
  this->unit = unit;
  this->specificity = specificity;
  (this->source).super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->source).super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->definition = (PropertyDefinition *)0x0;
  this->parser_index = -1;
  return;
}

Assistant:

Property(PropertyType value, Unit unit, int specificity = -1) : value(value), unit(unit), specificity(specificity)
	{
		definition = nullptr;
		parser_index = -1;
	}